

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O2

uint lace_get_pu_count(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  return (uint)lVar1;
}

Assistant:

unsigned int
lace_get_pu_count(void)
{
#ifdef WIN32
    SYSTEM_INFO sysinfo;
    GetSystemInfo(&sysinfo);
    unsigned int n_pus = sysinfo.dwNumberOfProcessors;
#elif defined(sched_getaffinity)
    cpu_set_t cs;
    CPU_ZERO(&cs);
    sched_getaffinity(0, sizeof(cs), &cs);
    unsigned int n_pus = CPU_COUNT(&cs);
#else
    unsigned int n_pus = sysconf(_SC_NPROCESSORS_ONLN);
#endif
    return n_pus;
}